

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O0

void __thiscall cinatra::coro_http_response::clear(coro_http_response *this)

{
  undefined4 *in_RDI;
  undefined2 local_a;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17d12b);
  if ((*(byte *)((long)in_RDI + 0xa1) & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::shrink_to_fit
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17d145);
  }
  std::vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>::clear
            ((vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_> *)0x17d152);
  std::optional<bool>::optional((optional<bool> *)0x17d15c);
  *(undefined2 *)(in_RDI + 10) = local_a;
  *(undefined1 *)((long)in_RDI + 0x2a) = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17d186);
  *(undefined1 *)(in_RDI + 0x28) = 0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie>_>_>
  ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie>_>_>
           *)0x17d19d);
  *(undefined1 *)((long)in_RDI + 0xa2) = 1;
  return;
}

Assistant:

void clear() {
    content_.clear();
    if (need_shrink_every_time_) {
      content_.shrink_to_fit();
    }

    resp_headers_.clear();
    keepalive_ = {};
    delay_ = false;
    status_ = status_type::init;
    fmt_type_ = format_type::normal;
    boundary_.clear();
    has_set_content_ = false;
    cookies_.clear();
    need_date_ = true;
  }